

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detach_info.cpp
# Opt level: O1

unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true> __thiscall
duckdb::DetachInfo::Copy(DetachInfo *this)

{
  OnEntryNotFound OVar1;
  DetachInfo *this_00;
  pointer pDVar2;
  pointer *__ptr;
  long in_RSI;
  
  this_00 = (DetachInfo *)operator_new(0x38);
  DetachInfo(this_00);
  (this->super_ParseInfo)._vptr_ParseInfo = (_func_int **)this_00;
  pDVar2 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)this);
  ::std::__cxx11::string::_M_assign((string *)&pDVar2->name);
  OVar1 = *(OnEntryNotFound *)(in_RSI + 0x30);
  pDVar2 = unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>::operator->
                     ((unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>,_true>
                       *)this);
  pDVar2->if_not_found = OVar1;
  return (unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>)
         (unique_ptr<duckdb::DetachInfo,_std::default_delete<duckdb::DetachInfo>_>)this;
}

Assistant:

unique_ptr<DetachInfo> DetachInfo::Copy() const {
	auto result = make_uniq<DetachInfo>();
	result->name = name;
	result->if_not_found = if_not_found;
	return result;
}